

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O2

void __thiscall TestRunner::changeConsoleColor(TestRunner *this,ConsoleColors color)

{
  if (color < (Green|Red)) {
    Logger::print<>(&DAT_00175e24 + *(int *)(&DAT_00175e24 + (ulong)color * 4));
    return;
  }
  return;
}

Assistant:

void TestRunner::changeConsoleColor(ConsoleColors color)
{
	switch (color)
	{
	case ConsoleColors::White:
		Logger::print("\033[1;0m");
		break;
	case ConsoleColors::Red:
		Logger::print("\033[1;31m");
		break;
	case ConsoleColors::Green:
		Logger::print("\033[1;32m");
		break;
	}
}